

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::log<std::__cxx11::string,std::__cxx11::string>
          (logger *this,source_loc loc,level_enum lvl,string_view_t fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  string_view_t a_logger_name;
  source_loc loc_00;
  iterator iVar1;
  char *s;
  size_t count;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  exception *ex;
  log_msg log_msg;
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this_00;
  logger *in_stack_fffffffffffffd38;
  log_msg *log_msg_00;
  logger *in_stack_fffffffffffffd40;
  string_view_t in_stack_fffffffffffffd48;
  buffer<char> *this_01;
  allocator<char> *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  basic_string_view<char> *in_stack_fffffffffffffd90;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  basic_string_view<char> local_218 [2];
  undefined8 local_1f8;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *pbStack_1f0;
  log_msg *local_1e8;
  buffer<char> *local_178;
  allocator<char> local_159;
  buffer<char> local_158 [9];
  undefined1 local_32;
  byte local_31;
  
  args_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0x00000008;
  local_31 = should_log(in_stack_fffffffffffffd38,
                        (level_enum)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  local_32 = details::backtracer::enabled((backtracer *)0x18cc23);
  if (((local_31 & 1) != 0) || ((bool)local_32)) {
    paVar2 = &local_159;
    std::allocator<char>::allocator();
    ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd30,(allocator<char> *)in_stack_fffffffffffffd28);
    std::allocator<char>::~allocator(&local_159);
    iVar1 = ::fmt::v6::
            format_to<fmt::v6::basic_string_view<char>,std::__cxx11::string_const&,std::__cxx11::string_const&,250ul,char>
                      (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_RDI,args_1_00);
    local_1e8 = (log_msg *)(args_1_00->field_2)._M_allocated_capacity;
    local_1f8 = *(undefined8 *)args_1_00;
    pbStack_1f0 = (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)
                  args_1_00->_M_string_length;
    local_178 = iVar1.container;
    ::fmt::v6::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    this_01 = local_158;
    s = ::fmt::v6::internal::buffer<char>::data(this_01);
    count = ::fmt::v6::internal::buffer<char>::size(this_01);
    ::fmt::v6::basic_string_view<char>::basic_string_view(local_218,s,count);
    loc_00._8_8_ = paVar2;
    loc_00.filename = (char *)iVar1.container;
    loc_00.funcname = (char *)args_1_00;
    a_logger_name.size_ = (size_t)s;
    a_logger_name.data_ = (char *)this_01;
    this_00 = pbStack_1f0;
    log_msg_00 = local_1e8;
    details::log_msg::log_msg
              ((log_msg *)in_stack_fffffffffffffd40,loc_00,a_logger_name,
               (level_enum)((ulong)local_1e8 >> 0x20),in_stack_fffffffffffffd48);
    log_it_(in_stack_fffffffffffffd40,log_msg_00,SUB81((ulong)this_00 >> 0x38,0),
            SUB81((ulong)this_00 >> 0x30,0));
    ::fmt::v6::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              (this_00);
  }
  return;
}

Assistant:

void log(source_loc loc, level::level_enum lvl, string_view_t fmt, const Args &... args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, args...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }